

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O1

void __thiscall
chrono::ChCoordsys<double>::ArchiveIN(ChCoordsys<double> *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_50;
  undefined ***local_48;
  undefined1 local_40;
  undefined **local_38;
  ChCoordsys<double> *local_30;
  
  ChArchiveIn::VersionRead<chrono::ChCoordsys<double>>(marchive);
  local_38 = &PTR__ChFunctorArchiveIn_001194e0;
  local_50 = "pos";
  local_40 = 0;
  local_48 = &local_38;
  local_30 = this;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_50);
  local_30 = (ChCoordsys<double> *)&this->rot;
  local_38 = &PTR__ChFunctorArchiveIn_00119548;
  local_50 = "rot";
  local_40 = 0;
  local_48 = &local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_50);
  return;
}

Assistant:

void ArchiveIN(ChArchiveIn& marchive) {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<ChCoordsys<double>>();
        // stream in all member data
        marchive >> CHNVP(pos);
        marchive >> CHNVP(rot);
    }